

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  bool bVar1;
  ImRect local_70;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined1 local_50 [8];
  ImRect rect_for_touch;
  ImRect rect_clipped;
  ImGuiContext *g;
  bool clip_local;
  ImVec2 *r_max_local;
  ImVec2 *r_min_local;
  
  rect_clipped.Max = (ImVec2)GImGui;
  ImRect::ImRect((ImRect *)&rect_for_touch.Max,r_min,r_max);
  if (clip) {
    ImRect::ClipWith((ImRect *)&rect_for_touch.Max,
                     (ImRect *)(*(long *)((long)rect_clipped.Max + 0x3fe0) + 0x250));
  }
  local_58 = ::operator-(&rect_for_touch.Max,(ImVec2 *)((long)rect_clipped.Max + 0x396c));
  local_60 = ::operator+(&rect_clipped.Min,(ImVec2 *)((long)rect_clipped.Max + 0x396c));
  ImRect::ImRect((ImRect *)local_50,&local_58,&local_60);
  bVar1 = ImRect::Contains((ImRect *)local_50,(ImVec2 *)((long)rect_clipped.Max + 0xd9c));
  if (bVar1) {
    local_70 = ImGuiViewportP::GetMainRect(*(ImGuiViewportP **)((long)rect_clipped.Max + 0x4228));
    bVar1 = ImRect::Overlaps(&local_70,(ImRect *)&rect_for_touch.Max);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      r_min_local._7_1_ = true;
    }
    else {
      r_min_local._7_1_ = false;
    }
  }
  else {
    r_min_local._7_1_ = false;
  }
  return r_min_local._7_1_;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    if (!g.MouseViewport->GetMainRect().Overlaps(rect_clipped))
        return false;
    return true;
}